

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O1

void __thiscall xLearn::InmemReader::SetShuffle(InmemReader *this,bool shuffle)

{
  uint uVar1;
  pointer puVar2;
  pointer puVar3;
  int iVar4;
  long lVar5;
  undefined7 in_register_00000031;
  long lVar6;
  
  (this->super_Reader).shuffle_ = shuffle;
  if (((int)CONCAT71(in_register_00000031,shuffle) != 0) &&
     ((this->order_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->order_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    srand((this->super_Reader).seed_);
    puVar2 = (this->order_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar3 = (this->order_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if ((puVar2 != puVar3) && (puVar2 + 1 != puVar3)) {
      lVar6 = 4;
      do {
        iVar4 = rand();
        lVar5 = (long)iVar4 % ((lVar6 >> 2) + 1);
        if (lVar6 != lVar5 * 4) {
          uVar1 = *(uint *)((long)puVar2 + lVar6);
          *(uint *)((long)puVar2 + lVar6) = puVar2[lVar5];
          puVar2[lVar5] = uVar1;
        }
        lVar5 = lVar6 + 4;
        lVar6 = lVar6 + 4;
      } while ((pointer)((long)puVar2 + lVar5) != puVar3);
    }
  }
  return;
}

Assistant:

virtual inline void SetShuffle(bool shuffle) {
    this->shuffle_ = shuffle;
    if (shuffle_ && !order_.empty()) {
      srand(this->seed_);
      random_shuffle(order_.begin(), order_.end());
    }
  }